

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>
::CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>
           *this,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                 *g)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->
  super_ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
  )._vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_0105c750;
  *(undefined8 *)
   &(this->generators_).
    super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
    .
    super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
    .
    super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
    .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>_>.
    super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_ =
       *(undefined8 *)
        &(g->
         super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
         ).
         super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
         .
         super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
         .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>_>.
         super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_;
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(g->
                   super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                   ).
                   super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                   .
                   super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                   .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>_>.
                   super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl
                   .impl_ + 8))->_M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->generators_).
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .
          super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .
          super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>_>.
          super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl + 8))->
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(g->
                   super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                   ).
                   super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                   .
                   super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                   .
                   super__Head_base<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_false>
                   ._M_head_impl.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
           + 8))->_M_pi;
  (this->generators_).
  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  .
  super__Head_base<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_false>
  ._M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (g->
            super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
            ).
            super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
            .
            super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
            .
            super__Head_base<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_false>
            ._M_head_impl.impl_.
            super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->generators_).
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .
          super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .
          super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .
          super__Head_base<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_false>
          ._M_head_impl.impl_ + 8))->_M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->generators_).
  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  .super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (g->
            super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
            ).
            super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
            .super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>.
            _M_head_impl.impl_.
            super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (g->
           super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
           ).
           super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
           .super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>.
           _M_head_impl.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->generators_).
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .
          super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
          .super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>.
          _M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
  + 8))->_M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->generators_).
  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  .
  super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (g->
            super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
            ).
            super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
            ._M_head_impl.impl_.
            super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (g->
           super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
           ).
           super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
           ._M_head_impl.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->generators_).
  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  .
  super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

CartesianProductGenerator(const std::tuple<ParamGenerator<T>...>& g)
      : generators_(g) {}